

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O0

int ReadPNM(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint64_t stride_00;
  void *__src;
  int in_ECX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  bool bVar5;
  uint32_t v;
  int k;
  uint32_t round;
  uint8_t *in;
  PNMInfo info;
  size_t offset;
  uint8_t *tmp_rgb;
  uint8_t *rgb;
  uint64_t depth;
  uint64_t sample_size;
  uint64_t pixel_bytes;
  uint64_t stride;
  int j;
  int i;
  int ok;
  PNMInfo *in_stack_00000358;
  uint8_t *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint local_b4;
  int local_b0;
  uint local_90;
  uint local_8c;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  size_t local_70;
  void *local_68;
  void *local_60;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  local_60 = (void *)0x0;
  local_70 = ReadHeader(in_stack_00000358);
  if (local_70 == 0) {
    fprintf(stderr,"Error parsing PNM header.\n");
  }
  else if (((int)local_7c < 5) || (7 < (int)local_7c)) {
    fprintf(stderr,"Unsupported P%d PNM format.\n",(ulong)local_7c);
  }
  else if (in_RDX != 0) {
    if (((int)local_90 < 0x4000) && ((int)local_8c < 0x4000)) {
      if (in_RSI < local_70 + (long)(int)local_90 * (long)(int)local_8c * (long)local_88) {
        fprintf(stderr,"Truncated PNM file (P%d).\n",(ulong)local_7c);
      }
      else {
        iVar4 = 1;
        if (0xff < (int)local_80) {
          iVar4 = 2;
        }
        bVar5 = true;
        if ((local_84 != 1) && (bVar5 = true, local_84 != 3)) {
          bVar5 = in_ECX == 0;
        }
        iVar2 = 4;
        if (bVar5) {
          iVar2 = 3;
        }
        stride_00 = (long)iVar2 * (long)(int)local_90;
        iVar3 = ImgIoUtilCheckSizeArgumentsOverflow(stride_00,(long)(int)local_8c);
        if ((iVar3 != 0) &&
           (local_60 = malloc(stride_00 * (long)(int)local_8c), local_60 != (void *)0x0)) {
          local_68 = local_60;
          for (local_34 = 0; local_34 < (int)local_8c; local_34 = local_34 + 1) {
            __src = (void *)(in_RDI + local_70);
            local_70 = (long)(int)(local_88 * local_90) + local_70;
            if ((local_80 == 0xff) && (2 < local_84)) {
              if ((local_84 == 3) || (in_ECX != 0)) {
                memcpy(local_68,__src,(long)(int)(local_84 * local_90));
              }
              else {
                for (local_30 = 0; local_30 < (int)local_90; local_30 = local_30 + 1) {
                  *(undefined1 *)((long)local_68 + (long)(local_30 * 3)) =
                       *(undefined1 *)((long)__src + (long)(local_30 << 2));
                  *(undefined1 *)((long)local_68 + (long)(local_30 * 3 + 1)) =
                       *(undefined1 *)((long)__src + (long)(local_30 * 4 + 1));
                  *(undefined1 *)((long)local_68 + (long)(local_30 * 3 + 2)) =
                       *(undefined1 *)((long)__src + (long)(local_30 * 4 + 2));
                }
              }
            }
            else {
              local_b0 = 0;
              for (local_30 = 0; local_30 < (int)(local_90 * local_84); local_30 = local_30 + 1) {
                if (iVar4 == 2) {
                  in_stack_ffffffffffffff44 =
                       (uint)*(byte *)((long)__src + (long)(local_30 << 1)) * 0x100 +
                       (uint)*(byte *)((long)__src + (long)(local_30 * 2 + 1));
                }
                else {
                  in_stack_ffffffffffffff44 = (uint)*(byte *)((long)__src + (long)local_30);
                }
                local_b4 = in_stack_ffffffffffffff44;
                if (local_80 != 0xff) {
                  local_b4 = (in_stack_ffffffffffffff44 * 0xff + (int)local_80 / 2) / local_80;
                }
                if (0xff < local_b4) {
                  local_b4 = 0xff;
                }
                uVar1 = (undefined1)local_b4;
                if (local_84 < 3) {
                  if ((local_84 == 1) || (local_30 % 2 == 0)) {
                    *(undefined1 *)((long)local_68 + (long)(local_b0 + 2)) = uVar1;
                    *(undefined1 *)((long)local_68 + (long)(local_b0 + 1)) = uVar1;
                    *(undefined1 *)((long)local_68 + (long)local_b0) = uVar1;
                    local_b0 = local_b0 + 3;
                  }
                  else if ((in_ECX != 0) && (local_84 == 2)) {
                    *(undefined1 *)((long)local_68 + (long)local_b0) = uVar1;
                    local_b0 = local_b0 + 1;
                  }
                }
                else if (((in_ECX != 0) || (local_84 != 4)) || (local_30 % 4 != 3)) {
                  *(undefined1 *)((long)local_68 + (long)local_b0) = uVar1;
                  local_b0 = local_b0 + 1;
                }
              }
            }
            local_68 = (void *)(stride_00 + (long)local_68);
          }
          *(uint *)(in_RDX + 8) = local_90;
          *(uint *)(in_RDX + 0xc) = local_8c;
          if ((long)iVar2 == 4) {
            iVar4 = WebPPictureImportRGBA
                              ((WebPPicture *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff38,0);
          }
          else {
            iVar4 = WebPPictureImportRGB
                              ((WebPPicture *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff38,0);
          }
          if (iVar4 == 0) {
            local_2c = 0;
          }
          else {
            local_2c = 1;
          }
        }
      }
    }
    else {
      fprintf(stderr,"Invalid %dx%d dimension for PNM\n",(ulong)local_90,(ulong)local_8c);
    }
  }
  free(local_60);
  return local_2c;
}

Assistant:

int ReadPNM(const uint8_t* const data, size_t data_size,
            WebPPicture* const pic, int keep_alpha,
            struct Metadata* const metadata) {
  int ok = 0;
  int i, j;
  uint64_t stride, pixel_bytes, sample_size, depth;
  uint8_t* rgb = NULL, *tmp_rgb;
  size_t offset;
  PNMInfo info;

  info.data = data;
  info.data_size = data_size;
  offset = ReadHeader(&info);
  if (offset == 0) {
    fprintf(stderr, "Error parsing PNM header.\n");
    goto End;
  }

  if (info.type < 5 || info.type > 7) {
    fprintf(stderr, "Unsupported P%d PNM format.\n", info.type);
    goto End;
  }

  // Some basic validations.
  if (pic == NULL) goto End;
  if (info.width > WEBP_MAX_DIMENSION || info.height > WEBP_MAX_DIMENSION) {
    fprintf(stderr, "Invalid %dx%d dimension for PNM\n",
                    info.width, info.height);
    goto End;
  }

  pixel_bytes = (uint64_t)info.width * info.height * info.bytes_per_px;
  if (data_size < offset + pixel_bytes) {
    fprintf(stderr, "Truncated PNM file (P%d).\n", info.type);
    goto End;
  }
  sample_size = (info.max_value > 255) ? 2 : 1;
  // final depth
  depth = (info.depth == 1 || info.depth == 3 || !keep_alpha) ? 3 : 4;
  stride = depth * info.width;
  if (stride != (size_t)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, info.height)) {
    goto End;
  }

  rgb = (uint8_t*)malloc((size_t)stride * info.height);
  if (rgb == NULL) goto End;

  // Convert input.
  // We only optimize for the sample_size=1, max_value=255, depth=1 case.
  tmp_rgb = rgb;
  for (j = 0; j < info.height; ++j) {
    const uint8_t* in = data + offset;
    offset += info.bytes_per_px * info.width;
    assert(offset <= data_size);
    if (info.max_value == 255 && info.depth >= 3) {
      // RGB or RGBA
      if (info.depth == 3 || keep_alpha) {
        memcpy(tmp_rgb, in, info.depth * info.width * sizeof(*in));
      } else {
        assert(info.depth == 4 && !keep_alpha);
        for (i = 0; i < info.width; ++i) {
          tmp_rgb[3 * i + 0] = in[4 * i + 0];
          tmp_rgb[3 * i + 1] = in[4 * i + 1];
          tmp_rgb[3 * i + 2] = in[4 * i + 2];
        }
      }
    } else {
      // Unoptimized case, we need to handle non-trivial operations:
      //   * convert 16b to 8b (if max_value > 255)
      //   * rescale to [0..255] range (if max_value != 255)
      //   * drop the alpha channel (if keep_alpha is false)
      const uint32_t round = info.max_value / 2;
      int k = 0;
      for (i = 0; i < info.width * info.depth; ++i) {
        uint32_t v = (sample_size == 2) ? 256u * in[2 * i + 0] + in[2 * i + 1]
                   : in[i];
        if (info.max_value != 255) v = (v * 255u + round) / info.max_value;
        if (v > 255u) v = 255u;
        if (info.depth > 2) {
          if (!keep_alpha && info.depth == 4 && (i % 4) == 3) {
            // skip alpha
          } else {
            tmp_rgb[k] = v;
            k += 1;
          }
        } else if (info.depth == 1 || (i % 2) == 0) {
          tmp_rgb[k + 0] = tmp_rgb[k + 1] = tmp_rgb[k + 2] = v;
          k += 3;
        } else if (keep_alpha && info.depth == 2) {
          tmp_rgb[k] = v;
          k += 1;
        } else {
          // skip alpha
        }
      }
    }
    tmp_rgb += stride;
  }

  // WebP conversion.
  pic->width = info.width;
  pic->height = info.height;
  ok = (depth == 4) ? WebPPictureImportRGBA(pic, rgb, (int)stride)
                    : WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) goto End;

  ok = 1;
 End:
  free((void*)rgb);

  (void)metadata;
  (void)keep_alpha;
  return ok;
}